

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_1::LineInterpolationTest::init
          (LineInterpolationTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  NotSupportedError *this_01;
  value_type_conflict2 local_1dc;
  value_type_conflict2 local_1d8;
  undefined1 local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  MessageBuilder local_1a0;
  float local_20 [2];
  float range [2];
  LineInterpolationTest *this_local;
  
  if (this->m_primitiveWideness == PRIMITIVEWIDENESS_NARROW) {
    ctx = (EVP_PKEY_CTX *)(long)this->m_iterationCount;
    range[1] = 1.0;
    std::vector<float,_std::allocator<float>_>::resize(&this->m_lineWidths,(size_type)ctx,range + 1)
    ;
  }
  else if (this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) {
    local_20[0] = 0.0;
    local_20[1] = 0.0;
    pRVar2 = gles3::Context::getRenderContext
                       ((this->super_BaseRenderingCase).super_TestCase.m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x818))(0x846e,local_20);
    this_00 = tcu::TestContext::getLog
                        ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1a0,(char (*) [29])"ALIASED_LINE_WIDTH_RANGE = [");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_20);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_20 + 1);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    if (local_20[1] <= 1.0) {
      local_1d2 = 1;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"wide line support required",&local_1d1);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_1d0);
      local_1d2 = 0;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    local_1d8 = 5.0;
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_lineWidths,&local_1d8);
    local_1dc = 10.0;
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_lineWidths,&local_1dc);
    ctx = (EVP_PKEY_CTX *)(local_20 + 1);
    std::vector<float,_std::allocator<float>_>::push_back
              (&this->m_lineWidths,(value_type_conflict2 *)ctx);
    this->m_maxLineWidth = local_20[1];
  }
  iVar1 = BaseRenderingCase::init(&this->super_BaseRenderingCase,ctx);
  return iVar1;
}

Assistant:

void LineInterpolationTest::init (void)
{
	// create line widths
	if (m_primitiveWideness == PRIMITIVEWIDENESS_NARROW)
	{
		m_lineWidths.resize(m_iterationCount, 1.0f);
	}
	else if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);

		m_testCtx.getLog() << tcu::TestLog::Message << "ALIASED_LINE_WIDTH_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;

		// no wide line support
		if (range[1] <= 1.0f)
			throw tcu::NotSupportedError("wide line support required");

		// set hand picked sizes
		m_lineWidths.push_back(5.0f);
		m_lineWidths.push_back(10.0f);
		m_lineWidths.push_back(range[1]);
		DE_ASSERT((int)m_lineWidths.size() == m_iterationCount);

		m_maxLineWidth = range[1];
	}
	else
		DE_ASSERT(false);

	// init parent
	BaseRenderingCase::init();
}